

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

int Gia_ManHashAndMulti(Gia_Man_t *p,Vec_Int_t *vLits)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  int LitRes;
  int Lit2;
  int Lit1;
  int k;
  int i;
  Vec_Int_t *vLits_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vLits);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    while (iVar1 = Vec_IntSize(vLits), 1 < iVar1) {
      Lit2 = 0;
      for (Lit1 = 0; iVar1 = Vec_IntSize(vLits), Lit1 + 1 < iVar1; Lit1 = Lit1 + 2) {
        iVar1 = Vec_IntEntry(vLits,Lit1);
        iLit1 = Vec_IntEntry(vLits,Lit1 + 1);
        iVar1 = Gia_ManHashAnd(p,iVar1,iLit1);
        Vec_IntWriteEntry(vLits,Lit2,iVar1);
        Lit2 = Lit2 + 1;
      }
      uVar2 = Vec_IntSize(vLits);
      if ((uVar2 & 1) != 0) {
        iVar1 = Vec_IntEntryLast(vLits);
        Vec_IntWriteEntry(vLits,Lit2,iVar1);
        Lit2 = Lit2 + 1;
      }
      Vec_IntShrink(vLits,Lit2);
    }
    iVar1 = Vec_IntSize(vLits);
    if (iVar1 != 1) {
      __assert_fail("Vec_IntSize(vLits) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                    ,799,"int Gia_ManHashAndMulti(Gia_Man_t *, Vec_Int_t *)");
    }
    p_local._4_4_ = Vec_IntEntry(vLits,0);
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManHashAndMulti( Gia_Man_t * p, Vec_Int_t * vLits )
{
    if ( Vec_IntSize(vLits) == 0 )
        return 0;
    while ( Vec_IntSize(vLits) > 1 )
    {
        int i, k = 0, Lit1, Lit2, LitRes;
        Vec_IntForEachEntryDouble( vLits, Lit1, Lit2, i )
        {
            LitRes = Gia_ManHashAnd( p, Lit1, Lit2 );
            Vec_IntWriteEntry( vLits, k++, LitRes );
        }
        if ( Vec_IntSize(vLits) & 1 )
            Vec_IntWriteEntry( vLits, k++, Vec_IntEntryLast(vLits) );
        Vec_IntShrink( vLits, k );
    }
    assert( Vec_IntSize(vLits) == 1 );
    return Vec_IntEntry(vLits, 0);
}